

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdD3D56TlvY::~MthdD3D56TlvY(MthdD3D56TlvY *this)

{
  MthdD3D56TlvY *this_local;
  
  ~MthdD3D56TlvY(this);
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		uint16_t tv = nv03_pgraph_convert_xy(val);
		if (cls != 0x48 && extr(exp.debug_a, 14, 1) && exp.dvd_format & 1) {
			if (tv >= 0x8000 && tv < 0x8008)
				tv = 0x8000;
			else
				tv -= 8;
		}
		insrt(exp.d3d56_tlv_xy, 16, 16, tv);
		insrt(exp.valid[1], 4, 1, 1);
		int vidx = (cls == 0x48 ? extr(exp.d3d56_tlv_fog_tri_col1, 0, 4) : idx);
		insrt(exp.valid[0], vidx, 1, 0);
	}